

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::updateStatus(HEkk *this,LpAction action)

{
  switch(action) {
  case kScale:
  case kScaledCol:
  case kScaledRow:
    (this->status_).has_nla = false;
    invalidateBasis(this);
    return;
  case kNewCosts:
  case kNewBounds:
    (this->status_).has_fresh_rebuild = false;
    (this->status_).has_dual_objective_value = false;
    (this->status_).has_primal_objective_value = false;
    return;
  case kNewBasis:
    invalidateBasis(this);
    return;
  case kNewCols:
  case kNewRows:
  case kDelCols:
  case kDelNonbasicCols:
  case kDelRows:
    clear(this);
    return;
  case kBacktracking:
    (this->status_).has_ar_matrix = false;
    (this->status_).has_fresh_rebuild = false;
    (this->status_).has_dual_objective_value = false;
    (this->status_).has_primal_objective_value = false;
  }
  return;
}

Assistant:

void HEkk::updateStatus(LpAction action) {
  assert(!this->status_.is_dualized);
  assert(!this->status_.is_permuted);
  switch (action) {
    case LpAction::kScale:
      this->invalidateBasisMatrix();
      break;
    case LpAction::kNewCosts:
      this->status_.has_fresh_rebuild = false;
      this->status_.has_dual_objective_value = false;
      this->status_.has_primal_objective_value = false;
      break;
    case LpAction::kNewBounds:
      this->status_.has_fresh_rebuild = false;
      this->status_.has_dual_objective_value = false;
      this->status_.has_primal_objective_value = false;
      break;
    case LpAction::kNewBasis:
      this->invalidateBasis();
      break;
    case LpAction::kNewCols:
      this->clear();
      //    this->invalidateBasisArtifacts();
      break;
    case LpAction::kNewRows:
      if (kExtendInvertWhenAddingRows) {
        // Just clear Ekk data
        this->clearEkkData();
      } else {
        // Clear everything
        this->clear();
      }
      //    this->invalidateBasisArtifacts();
      break;
    case LpAction::kDelCols:
      this->clear();
      //    this->invalidateBasis();
      break;
    case LpAction::kDelNonbasicCols:
      this->clear();
      //    this->invalidateBasis();
      break;
    case LpAction::kDelRows:
      this->clear();
      //   this->invalidateBasis();
      break;
    case LpAction::kDelRowsBasisOk:
      assert(1 == 0);
      //      info.lp_ = true;
      break;
    case LpAction::kScaledCol:
      this->invalidateBasisMatrix();
      break;
    case LpAction::kScaledRow:
      this->invalidateBasisMatrix();
      break;
    case LpAction::kBacktracking:
      this->status_.has_ar_matrix = false;
      this->status_.has_fresh_rebuild = false;
      this->status_.has_dual_objective_value = false;
      this->status_.has_primal_objective_value = false;
      break;
    default:
      break;
  }
}